

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unixFullPathname(unqlite_vfs *pVfs,char *zPath,int nOut,char *zOut)

{
  char *pcVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  
  if (*zPath == '/') {
    Systrcpy(zOut,nOut,zPath,0);
  }
  else {
    zOut[(long)nOut + -1] = '\0';
    pcVar3 = getcwd(zOut,(long)nOut - 1);
    if (pcVar3 == (char *)0x0) {
      return -2;
    }
    pcVar4 = zOut;
    if (*zOut != '\0') {
      pcVar1 = zOut + 2;
      do {
        pcVar4 = pcVar1;
        if (pcVar4[-1] == '\0') {
          pcVar4 = pcVar4 + -1;
          goto LAB_0010f809;
        }
        if (*pcVar4 == '\0') goto LAB_0010f809;
        if (pcVar4[1] == '\0') {
          pcVar4 = pcVar4 + 1;
          goto LAB_0010f809;
        }
        pcVar1 = pcVar4 + 4;
      } while (pcVar4[2] != '\0');
      pcVar4 = pcVar4 + 2;
    }
LAB_0010f809:
    uVar2 = (int)pcVar4 - (int)zOut;
    SyBufferFormat(zOut + uVar2,nOut - uVar2,"/%s",zPath);
    if (pcVar3 == (char *)0x0) {
      return -2;
    }
  }
  return 0;
}

Assistant:

static int unixFullPathname(
  unqlite_vfs *pVfs,            /* Pointer to vfs object */
  const char *zPath,            /* Possibly relative input path */
  int nOut,                     /* Size of output buffer in bytes */
  char *zOut                    /* Output buffer */
){
  if( zPath[0]=='/' ){
	  Systrcpy(zOut,(sxu32)nOut,zPath,0);
	  SXUNUSED(pVfs);
  }else{
    sxu32 nCwd;
	zOut[nOut-1] = '\0';
    if( getcwd(zOut, nOut-1)==0 ){
		return UNQLITE_IOERR;
    }
    nCwd = SyStrlen(zOut);
    SyBufferFormat(&zOut[nCwd],(sxu32)nOut-nCwd,"/%s",zPath);
  }
  return UNQLITE_OK;
}